

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unarc.c
# Opt level: O1

int do_unarc(void)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Word WVar4;
  char cVar5;
  Byte BVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  Ftype FVar10;
  Status SVar11;
  int iVar12;
  Ferror FVar13;
  FILE *__stream;
  char *pcVar14;
  Header *header;
  size_t sVar15;
  FILE *__stream_00;
  CompType type;
  uint uVar16;
  FILE *pFVar17;
  bool bVar18;
  char fullname [1024];
  FILE *local_468;
  FILE *local_460;
  char *local_458;
  int local_44c;
  int local_448;
  uint local_444;
  uint local_440;
  Word local_43c;
  char local_438 [1032];
  
  __stream = fopen(archive,"r");
  if (__stream == (FILE *)0x0) {
    pcVar14 = name_dot_arc(archive);
    __stream = fopen(pcVar14,"r");
    if (__stream == (FILE *)0x0) {
      if (quiet != '\0') {
        return 1;
      }
      error("cannot open archive \"%s\"",archive);
      return 1;
    }
    archive = name_dot_arc(archive);
  }
  local_43c = filesize(archive);
  if ((local_43c == 0) && (quiet == '\0')) {
    error("cannot get size of archive file");
    fclose(__stream);
    return 1;
  }
  if ((inffiles == '\0') && (logfile != (char *)0x0 && (listing == '\0' && testing == '\0'))) {
    local_468 = fopen(logfile,"w");
    if (local_468 == (FILE *)0x0) {
      local_468 = (FILE *)0x0;
      warning("unable to open logfile \"%s\"",logfile);
    }
  }
  else {
    local_468 = (FILE *)0x0;
  }
  if ((quiet == '\0') && (verbose != '\0')) {
    msg("filename                          size load/date   exec/time type storage");
    msg("--------                          ---- ----------- --------- ---- -------");
  }
  local_458 = (char *)0x0;
  local_448 = 0;
  iVar8 = 0;
  local_44c = 0;
  local_444 = 0;
  local_440 = 0;
LAB_00102e4f:
  local_460 = (FILE *)0x0;
  iVar12 = iVar8;
LAB_00102e58:
  iVar8 = iVar12;
  if ((arcfs == 0) && (BVar6 = read_byte((FILE *)__stream), BVar6 != '\x1a')) {
    bVar18 = true;
    if (BVar6 != 'A') goto LAB_00103629;
    BVar6 = read_byte((FILE *)__stream);
    if (BVar6 != 'r') goto LAB_00103629;
    BVar6 = read_byte((FILE *)__stream);
    if (BVar6 != 'c') goto LAB_00103629;
    BVar6 = read_byte((FILE *)__stream);
    if (BVar6 != 'h') goto LAB_00103629;
    BVar6 = read_byte((FILE *)__stream);
    if (BVar6 != 'i') goto LAB_00103629;
    BVar6 = read_byte((FILE *)__stream);
    if (BVar6 != 'v') goto LAB_00103629;
    BVar6 = read_byte((FILE *)__stream);
    if (BVar6 != 'e') goto LAB_00103629;
    BVar6 = read_byte((FILE *)__stream);
    if (BVar6 != '\0') goto LAB_00103629;
    debug("ArcFS format archive\n");
    arcfs = 1;
  }
LAB_00102f03:
  header = read_header((FILE *)__stream);
  bVar7 = header->comptype;
  uVar16 = bVar7 & 0x7f;
  WVar4 = local_43c;
  if (((bVar7 & 0x7f) != 0) &&
     (((uVar16 != 2 || ((header->load & 0xffffff00) != 0xfffddc00)) &&
      (WVar4 = local_43c - header->complen, local_43c < header->complen)))) {
    debug("compressed len > archive file len");
    bVar18 = true;
    goto LAB_00103629;
  }
  local_43c = WVar4;
  iVar12 = iVar8;
  if ((char)uVar16 == '\x02') {
    if ((header->load & 0xffffff00) == 0xfffddc00) {
      local_448 = local_448 + 1;
      local_458 = downlevel(header->name);
      do_unarc::dirheader.comptype = header->comptype;
      do_unarc::dirheader.name[0] = header->name[0];
      do_unarc::dirheader.name[1] = header->name[1];
      do_unarc::dirheader.name[2] = header->name[2];
      do_unarc::dirheader.name[3] = header->name[3];
      do_unarc::dirheader.name[4] = header->name[4];
      do_unarc::dirheader.name[5] = header->name[5];
      do_unarc::dirheader.name[6] = header->name[6];
      do_unarc::dirheader._8_8_ = *(undefined8 *)(header->name + 7);
      do_unarc::dirheader.complen = header->complen;
      do_unarc::dirheader.date = header->date;
      do_unarc::dirheader.time = header->time;
      uVar1._0_2_ = header->crc;
      uVar1._2_2_ = *(undefined2 *)&header->field_0x1a;
      uVar1._4_4_ = header->origlen;
      uVar2 = header->origlen;
      uVar3 = header->load;
      do_unarc::dirheader.exec = header->exec;
      do_unarc::dirheader.attr = header->attr;
      do_unarc::dirheader._24_4_ = SUB84(uVar1,0);
      do_unarc::dirheader.origlen = uVar2;
      do_unarc::dirheader.load = uVar3;
      if (((testing == '\0') && (listing == '\0')) &&
         ((to_stdout == '\0' && (iVar8 = inlist(local_458), iVar8 != 0)))) {
        FVar10 = exist(local_458);
        if (FVar10 == NOEXIST) {
          iVar8 = makedir(local_458);
          if ((iVar8 < 0) && (quiet == '\0')) {
            msg("error making %s... aborting",local_458);
            iVar12 = 4;
          }
        }
        else if (FVar10 == ISFILE) {
          iVar8 = 4;
          if (quiet == '\0') {
            msg("%s exists as a file... aborting",local_458);
          }
          goto LAB_0010378b;
        }
      }
      goto LAB_00102e58;
    }
  }
  else if ((bVar7 & 0x7f) == 0) {
    bVar18 = false;
    if (local_448 == 0) goto LAB_00103629;
    if ((((((testing == '\0') && (listing == '\0')) && (to_stdout == '\0')) &&
         ((stamp != '\0' && (iVar8 = inlist(local_458), iVar8 != 0)))) &&
        (iVar8 = filestamp(&do_unarc::dirheader,local_458), iVar8 < 0)) && (quiet == '\0')) {
      error("error stamping %s",local_458);
    }
    local_448 = local_448 + -1;
    local_458 = uplevel();
    goto LAB_00102e58;
  }
  if (local_458 == (char *)0x0) {
    strcpy(local_438,header->name);
  }
  else {
    sprintf(local_438,"%s%c%s",local_458,0x2f);
  }
  iVar9 = inlist(local_438);
  if (iVar9 == 0) {
LAB_00103179:
    fseek(__stream,(ulong)header->complen,1);
    goto LAB_00102e58;
  }
  if ((quiet == '\0') && (msg("%-30s",local_438), verbose != '\0')) {
    print_details(header);
  }
  local_440 = local_440 + 1;
  local_444 = local_444 + header->origlen;
  if (listing != '\0') {
    if (quiet == '\0') {
      putc(10,_stderr);
    }
    goto LAB_00103179;
  }
  if (quiet == '\0') {
    putc(0x20,_stderr);
  }
  if ((apptype != '\0') && (to_stdout == '\0')) {
    append_type(header,local_438);
  }
  if (to_stdout == '\0' && testing == '\0') {
    do {
      FVar10 = exist(local_438);
      if (FVar10 != ISFILE) {
        if (FVar10 != ISDIR) goto LAB_00103331;
        if (quiet == '\0') {
          msg("exists as a directory... skipping");
        }
        goto LAB_00102e58;
      }
      if (force != '\0') goto LAB_00103331;
      cVar5 = prompt_user(local_438);
      iVar9 = 0;
      if (cVar5 == 'a') {
        force = '\x01';
      }
      else if (cVar5 == 'n') {
        fseek(__stream,(ulong)header->complen,1);
        iVar9 = 2;
      }
      else if (cVar5 == 'r') {
        get_newname();
        if (local_458 == (char *)0x0) {
          strcpy(local_438,get_newname::buffer);
        }
        else {
          sprintf(local_438,"%s%c%s",local_458,0x2f,get_newname::buffer);
        }
        iVar9 = 7;
      }
    } while (iVar9 == 7);
    if (iVar9 != 0) goto LAB_00102e58;
LAB_00103331:
    local_460 = fopen(local_438,"w");
    if (local_460 == (FILE *)0x0) {
      local_460 = (FILE *)0x0;
      if (quiet != '\0') goto LAB_00102e58;
      msg("unable to create");
      goto LAB_00102e4f;
    }
  }
  else if (testing == '\0') {
    local_460 = _stdout;
  }
  writesize = (long)header->origlen;
  crcsize = writesize;
  switch(uVar16) {
  case 1:
  case 2:
    SVar11 = unstore(header,(FILE *)__stream,(FILE *)local_460);
    break;
  case 3:
    SVar11 = unpack(header,(FILE *)__stream,(FILE *)local_460);
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    goto switchD_00103376_caseD_4;
  case 8:
    type = CRUNCH;
    goto LAB_0010342d;
  case 9:
    type = SQUASH;
LAB_0010342d:
    SVar11 = uncompress(header,(FILE *)__stream,(FILE *)local_460,type);
    break;
  default:
    goto switchD_00103376_default;
  }
  if (((testing == '\0') && (to_stdout == '\0')) && (local_460 != (FILE *)0x0)) {
    fclose(local_460);
    local_460 = (FILE *)0x0;
  }
  pFVar17 = local_468;
  switch(SVar11) {
  case NOERR:
    if (((testing == '\0') && (to_stdout == '\0')) &&
       ((stamp != '\0' && ((iVar12 = filestamp(header,local_438), iVar12 < 0 && (quiet == '\0'))))))
    {
      msg("\nerror stamping %s",local_438);
    }
    if (testing == '\0') {
      if (inffiles == '\0') {
        pFVar17 = (FILE *)0x0;
        if (local_468 != (FILE *)0x0) {
          pcVar14 = riscos_path(local_438);
          fprintf(local_468,"SYS \"OS_File\", 1, \"%s\", &%08lX, &%08lX,, &%X\n",pcVar14,
                  (ulong)header->load,(ulong)header->exec,(ulong)header->attr);
          pFVar17 = local_468;
        }
      }
      else {
        strcpy(logfile,local_438);
        pcVar14 = logfile;
        sVar15 = strlen(logfile);
        builtin_strncpy(pcVar14 + sVar15,".inf",5);
        __stream_00 = fopen(logfile,"w");
        pFVar17 = (FILE *)0x0;
        if (__stream_00 != (FILE *)0x0) {
          pcVar14 = riscos_path(local_438);
          fprintf(__stream_00,"%s %08lX %08lX\n",pcVar14,(ulong)header->load,(ulong)header->exec);
          fclose(__stream_00);
          pFVar17 = __stream_00;
        }
      }
    }
    break;
  case RERR:
    iVar8 = 3;
    bVar18 = false;
    if (quiet == '\0') {
      bVar18 = false;
      error("error reading archive");
    }
    goto LAB_00103629;
  case WERR:
    if (quiet == '\0') {
      msg("error writing file");
    }
    break;
  case CRCERR:
    if (quiet == '\0') {
      msg("failed CRC check");
    }
    debug("  calculated CRC=0X%X",(ulong)crc);
  }
  if (quiet == '\0') {
    putc(10,_stderr);
  }
  bVar18 = false;
  local_468 = pFVar17;
  iVar12 = 0;
  if (iVar8 != 0) {
LAB_00103629:
    if (bVar18) {
      FVar13 = check_stream((FILE *)__stream);
      if (FVar13 == FNOERR) {
        if (quiet == '\0') {
          msg("bad archive header");
        }
        if ((retry == '\0') || (listing != '\0')) {
          iVar8 = 2;
          if (quiet == '\0') {
            putc(10,_stderr);
          }
        }
        else {
          msg("... retrying");
LAB_00103691:
          FVar13 = check_stream((FILE *)__stream);
          if (FVar13 == FNOERR) {
            local_44c = local_44c + 1;
            do {
              BVar6 = read_byte((FILE *)__stream);
              if (BVar6 == '\x1a') {
                bVar7 = read_byte((FILE *)__stream);
                uVar16 = bVar7 & 0x7f;
                if (((uVar16 < 10) && ((0x30eU >> (bVar7 & 0x1f) & 1) != 0)) || (uVar16 == 0x7f))
                goto LAB_001036e7;
              }
              FVar13 = check_stream((FILE *)__stream);
              if (FVar13 != FNOERR) break;
            } while( true );
          }
          iVar8 = 2;
        }
      }
      else if ((FVar13 == FRWERR) && (iVar8 = 3, quiet == '\0')) {
        msg("error reading archive");
      }
    }
LAB_0010378b:
    if (verbose != '\0') {
      msg("total of %ld bytes in %d files\n",(ulong)local_444,(ulong)local_440);
    }
    if ((local_460 != (FILE *)0x0) && (to_stdout == '\0')) {
      fclose(local_460);
    }
    if (local_468 != (FILE *)0x0) {
      fclose(local_468);
    }
    fclose(__stream);
    return iVar8;
  }
  goto LAB_00102e58;
switchD_00103376_default:
  if (uVar16 == 0x7f) {
    type = COMPRESS;
    goto LAB_0010342d;
  }
switchD_00103376_caseD_4:
  error("unsupported archive type %d",(ulong)uVar16);
  if (local_44c != 0) goto LAB_00103691;
  fseek(__stream,(ulong)header->complen,1);
  local_44c = 0;
  goto LAB_00102e58;
LAB_001036e7:
  ungetc((uint)bVar7,__stream);
  goto LAB_00102f03;
}

Assistant:

int
do_unarc()
{
	FILE *ifp, *ofp = NULL, *lfp = NULL;
	Header *header = NULL;
	char *pathname = NULL;
	char fullname[PATHNAMELEN];
	int level = 0, ret = 0, retrying = 0;
	Word arcsize;
	Word nbytes = 0;
	int nfiles = 0;
	Status status;

	ifp = fopen(archive, R_OPENMODE);
	if (!ifp)
	{
		ifp = fopen(name_dot_arc(archive), R_OPENMODE);
		if (!ifp)
		{
			if (!quiet)
				error("cannot open archive \"%s\"", archive);
			return (1);
		}
		archive = name_dot_arc(archive);
	}

	arcsize = filesize(archive);
	if (!arcsize && !quiet)
	{
		error("cannot get size of archive file");
		fclose(ifp);
		return (1);
	}

	/* MU changed to accomodate the -I option */
	if (!inffiles)
	{
		if (!testing && !listing && logfile)
		{
			lfp = fopen(logfile, W_OPENMODE);
			if (!lfp)
				warning("unable to open logfile \"%s\"", logfile);
		}
	}

	if (!quiet && verbose)
	{
		msg("filename                          size load/date   exec/time type storage");
		msg("--------                          ---- ----------- --------- ---- -------");
	}

	/*
	 * read compressed files from archive until end of file...
	 */
	while (1)
	{
		static Header dirheader;
		Byte comptype, first;

		header = NULL;
		if ((arcfs == 0) && ((first = read_byte(ifp)) != STARTBYTE))
		{
			if ((first == 'A') &&
				(read_byte(ifp) == 'r') &&
				(read_byte(ifp) == 'c') &&
				(read_byte(ifp) == 'h') &&
				(read_byte(ifp) == 'i') &&
				(read_byte(ifp) == 'v') &&
				(read_byte(ifp) == 'e') && (read_byte(ifp) == '\0'))
			{
				debug("ArcFS format archive\n");
				arcfs = 1;
			}
			else
				break;
		}
	  retry_loop:
		header = read_header(ifp);
		comptype = header->comptype & 0x7f;
#ifdef DEBUGGING
		debug("archive file length = %ld  level = %d\n", arcsize,
			   level);
		print_header(header);
#endif							/* DEBUGGING */

		/*
		 * If this is a compress _file_ then check archive size against
		 * compress-file length...
		 */
		if (comptype && !(comptype == CT_NOTCOMP2 &&
						  /* BB changed constants in next line to long */
						  (header->load & 0xffffff00l) == 0xfffddc00l))
		{
			if (header->complen > arcsize)
			{
				debug("compressed len > archive file len");
				header = NULL;
				break;
			}
			else
				arcsize -= header->complen;
		}

		if (!comptype)
		{						/* end of archive ? */
			if (!level)
				break;
			level--;
			/*
			 * stamp directory now that all files have
			 * been written into it
			 */
			if (!testing && !listing && !to_stdout && stamp && inlist(pathname))
				if (filestamp(&dirheader, pathname) < 0 && !quiet)
					error("error stamping %s", pathname);
			pathname = uplevel();
			continue;
		}

		/*
		 * test for directory or file (file type = &DDC = archive)
		 */
		if (comptype == CT_NOTCOMP2 &&
			/* BB changed constants in next line to long */
			(header->load & 0xffffff00l) == 0xfffddc00l)
		{
			level++;
			pathname = downlevel(header->name);
			dirheader = *header;	/* make copy of header */

			/*
			 * create directory
			 */
			if (!testing && !listing && !to_stdout && inlist(pathname))
				switch (exist(pathname))
				{
				case NOEXIST:
					if (makedir(pathname) < 0 && !quiet)
					{
						msg("error making %s... aborting", pathname);
						ret = 4;
						break;
					}
					break;

				case ISFILE:
					if (!quiet)
						msg("%s exists as a file... aborting",
							   pathname);
					ret = 4;
					goto unarc_exit;
				case ISDIR:
				default:
					break;
				}
		}
		else
		{						/* file */
			if (pathname)
				sprintf(fullname, "%s%c%s", pathname, PATHSEP,
						header->name);
			else
				strcpy(fullname, header->name);

			if (!inlist(fullname))
			{
				fseek(ifp, (long) header->complen, 1);
				continue;
			}

			/*
			 * print the archive file details...
			 */
			if (!quiet)
			{
				msg("%-30s", fullname);
				if (verbose)
					print_details(header);
			}

			/* add to totals */
			nbytes += header->origlen;
			nfiles++;

			if (listing)
			{
				/* if listing, nothing more to do */
				if (!quiet)
					putc('\n', stderr);
				fseek(ifp, (long) header->complen, 1);
				continue;
			}
			else if (!quiet)
				putc(' ', stderr);

			/*
			 * append the filetype to the name
			 */
			if (apptype && !to_stdout)
				append_type(header, fullname);

			/*
			 * if actually unarchiving then check if the file already exists
			 */
			if (!testing && !to_stdout)
			{
			  test_exist:
				switch (exist(fullname))
				{
				case ISFILE:
					if (!force)
					{
						char c = prompt_user(fullname);
						if (c == 'a')
							force = 1;
						else if (c == 'n')
						{
							fseek(ifp, (long) header->complen, 1);
							continue;
						}
						else if (c == 'r')
						{
							char *newname = get_newname();
							if (pathname)
								sprintf(fullname, "%s%c%s", pathname,
										PATHSEP, newname);
							else
								strcpy(fullname, newname);
							goto test_exist;
						}
						/* if (c == 'y') FALLTHROUGH */
					}
					break;
				case ISDIR:
					if (!quiet)
						msg("exists as a directory... skipping");
					continue;
				case NOEXIST:
				default:
					break;
				}
				ofp = fopen(fullname, W_OPENMODE);
				if (!ofp)
				{
					if (!quiet)
						msg("unable to create");
					continue;
				}
			}
			else if (!testing)
			{
				ofp = stdout;
			}

			/*
			 * do the unpacking
			 */
			crcsize = writesize = header->origlen;
			switch (comptype)
			{
			case CT_NOTCOMP:
			case CT_NOTCOMP2:
				status = unstore(header, ifp, ofp);
				break;
			case CT_CRUNCH:
				status = uncompress(header, ifp, ofp, CRUNCH);
				break;
			case CT_PACK:
				status = unpack(header, ifp, ofp);
				break;
			case CT_SQUASH:
				status = uncompress(header, ifp, ofp, SQUASH);
				break;
			case CT_COMP:
				status = uncompress(header, ifp, ofp, COMPRESS);
				break;
			default:
				error("unsupported archive type %d", comptype);
				if (retrying)
					goto do_retry;
				fseek(ifp, (long) header->complen, 1);
				continue;
			}

			if (!testing && !to_stdout && ofp)
			{
				fclose(ofp);
				ofp = NULL;
			}

			/*
			 * check if unarchiving failed.
			 * (RERR check is not in switch() because `break'
			 * needs to escape from while())
			 */
			if (status == RERR)
			{
				if (!quiet)
					error("error reading archive");
				ret = 3;
				break;
			}
			switch (status)
			{
			case WERR:
				if (!quiet)
					msg("error writing file");
				break;
			case CRCERR:
				if (!quiet)
					msg("failed CRC check");

				/* BB changed format in next line to long hex */
				/* debug("  calculated CRC=0x%x", crc); */
#ifdef __MSDOS__
				debug("  calculated CRC=0X%lX", crc);
#else
				debug("  calculated CRC=0X%X", crc);
#endif							/* __MSDOS__ */
				break;
			case NOERR:
				if (!testing && !to_stdout && stamp)
				{
					if (filestamp(header, fullname) < 0 && !quiet)
						msg("\nerror stamping %s", fullname);
				}
				/* 
				 * XXX: if the filename has had it's filetype appended to
				 * it, it may be longer than 10 characters long making this
				 * file useless.  We could truncate the filename but there is
				 * no need to under UNIX... bit of a mismatch!
				 */
				if (!testing)
				{
					if (inffiles)
					{
						strcpy(logfile, fullname);
						strcat(logfile, ".inf");
						lfp = fopen(logfile, W_OPENMODE);

						if (lfp)
						{

/*
					// BASIC 
					if ((header->load => 0xFFFFFB41) && (header->load <= 0xFFFFFB46))
					{
						header->load = 0xFFFF1900;
						header->exec = 0xFFFF802B;
					}

					// *EXEC ie !BOOT 
					if (header->load == 0xFFFFFE41)
					{
						header->load = 0x00000000;
						header->exec = 0xFFFFFFFF;
					}
*/
							fprintf(lfp, "%s %08lX %08lX\n",
									riscos_path(fullname), (long)header->load,
									(long)header->exec);
							fclose(lfp);

						}

					}
					else
					{
						if (lfp)
						{
							fprintf(lfp,
									"SYS \"OS_File\", 1, \"%s\", &%08lX, &%08lX,, &%X\n",
									riscos_path(fullname), (long)header->load,
									(long)header->exec, header->attr);
						}
					}

				}
				break;
			default:
				break;
			}

			if (!quiet)
				putc('\n', stderr);
			if (ret)
				break;
		}
	}

	/*
	 * find out why header wasn't found
	 */
	if (!header)
		switch (check_stream(ifp))
		{
		case FNOERR:
			if (!quiet)
				msg("bad archive header");
			if (retry && !listing)
			{
				msg("... retrying");
			  do_retry:
				retrying++;
				while (check_stream(ifp) == FNOERR)
					if (read_byte(ifp) == STARTBYTE)
					{
						Byte byte = read_byte(ifp);
						switch (byte & 0x7f)
						{
						case (CT_NOTCOMP):
						case (CT_NOTCOMP2):
						case (CT_CRUNCH):
						case (CT_PACK):
						case (CT_SQUASH):
						case (CT_COMP):
							ungetc((int) byte, ifp);
							goto retry_loop;
							/* NOTREACHED */
						default:
							break;
						}
					}
			}
			else
			{
				retrying = 0;
				if (!quiet)
					putc('\n', stderr);
			}
			ret = 2;
			break;
		case FRWERR:
			if (!quiet)
				msg("error reading archive");
			ret = 3;
			break;
		case FEND:
		default:
			break;
		}

  unarc_exit:

	if (verbose)
		msg("total of %ld bytes in %d files\n", (long)nbytes, nfiles);

	if (ofp && !to_stdout)
		fclose(ofp);
	if (lfp)
		fclose(lfp);
	if (ifp)
		fclose(ifp);
	return (ret);
}